

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifile.cpp
# Opt level: O0

void __thiscall ifile::ifile_t::error(ifile_t *this,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 auStack_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined8 *local_8;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fprintf(_stderr,"\nERROR (file: %s, line: %ld, column: %ld): ",*in_RDI,in_RDI[2],in_RDI[3]);
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_18 = auStack_d8;
  vfprintf(_stderr,local_10,&local_28);
  fprintf(_stderr,"\n");
  exit(1);
}

Assistant:

void ifile_t::error( const char * msg, ... ) const
    {
        va_list args;
        fprintf( stderr, "\nERROR (file: %s, line: %ld, column: %ld): ", path, line, col );
        va_start( args, msg );
        vfprintf( stderr, msg, args );
        va_end( args );
        fprintf( stderr, "\n" );
        exit( 1 );
    }